

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::RunSingleCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *command,string *captureStdOut,string *captureStdErr,int *retVal,char *dir,
               OutputOption outputflag,double timeout)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  cmsysProcess *cp;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  pointer pbVar7;
  bool bVar8;
  int length;
  char *data;
  vector<char,_std::allocator<char>_> tempStdOut;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  vector<char,_std::allocator<char>_> tempStdErr;
  int local_b4;
  char *local_b0;
  char *local_a8;
  undefined8 uStack_a0;
  long local_98;
  char **local_88;
  iterator iStack_80;
  char **local_78;
  void *local_68;
  undefined8 uStack_60;
  long local_58;
  char *local_48;
  int *local_40;
  double local_38;
  
  local_88 = (char **)0x0;
  iStack_80._M_current = (char **)0x0;
  local_78 = (char **)0x0;
  pbVar7 = (command->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_40 = retVal;
  local_38 = timeout;
  if (pbVar7 == (command->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
LAB_0024343b:
    local_a8 = (char *)0x0;
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_88,iStack_80,&local_a8);
  }
  else {
    local_48 = dir;
    do {
      local_a8 = (pbVar7->_M_dataplus)._M_p;
      if (iStack_80._M_current == local_78) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_88,iStack_80,&local_a8)
        ;
      }
      else {
        *iStack_80._M_current = local_a8;
        iStack_80._M_current = iStack_80._M_current + 1;
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != (command->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
    local_a8 = (char *)0x0;
    dir = local_48;
    if (iStack_80._M_current == local_78) goto LAB_0024343b;
    *iStack_80._M_current = (char *)0x0;
    iStack_80._M_current = iStack_80._M_current + 1;
  }
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp,local_88);
  cmsysProcess_SetWorkingDirectory(cp,dir);
  if (s_RunCommandHideConsole == true) {
    cmsysProcess_SetOption(cp,0,1);
  }
  if (outputflag == OUTPUT_MERGE) {
LAB_002434cf:
    cmsysProcess_SetOption(cp,2,1);
LAB_002434ea:
    bVar2 = false;
    captureStdErr = (string *)0x0;
  }
  else {
    if (outputflag == OUTPUT_PASSTHROUGH) {
      cmsysProcess_SetPipeShared(cp,2,1);
      cmsysProcess_SetPipeShared(cp,3,1);
      captureStdOut = (string *)0x0;
      goto LAB_002434ea;
    }
    if (captureStdErr == (string *)0x0) goto LAB_002434ea;
    bVar2 = true;
    if (captureStdErr == captureStdOut) goto LAB_002434cf;
  }
  cmsysProcess_SetTimeout(cp,local_38);
  cmsysProcess_Execute(cp);
  local_a8 = (char *)0x0;
  uStack_a0 = 0;
  local_98 = 0;
  local_58 = 0;
  local_68 = (void *)0x0;
  uStack_60 = 0;
  if ((outputflag != OUTPUT_PASSTHROUGH) &&
     (!(bool)(outputflag == OUTPUT_NONE & ~bVar2 & captureStdOut == (string *)0x0))) {
    while (iVar3 = cmsysProcess_WaitForData(cp,&local_b0,&local_b4,(double *)0x0), 0 < iVar3) {
      if (0 < local_b4) {
        lVar6 = 0;
        do {
          if (local_b0[lVar6] == '\0') {
            local_b0[lVar6] = ' ';
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < local_b4);
      }
      if (iVar3 == 2) {
        if (outputflag != OUTPUT_NONE) {
          Stdout(local_b0,(long)local_b4);
        }
        if (captureStdOut != (string *)0x0) {
          std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                    ((vector<char,std::allocator<char>> *)&local_a8,uStack_a0);
        }
      }
      else if (iVar3 == 3) {
        if (outputflag != OUTPUT_NONE) {
          Stderr(local_b0,(long)local_b4);
        }
        if (bVar2) {
          std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                    ((vector<char,std::allocator<char>> *)&local_68,uStack_60);
        }
      }
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  if (captureStdOut != (string *)0x0) {
    pcVar1 = (captureStdOut->_M_dataplus)._M_p;
    std::__cxx11::string::
    _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)captureStdOut,pcVar1,pcVar1 + captureStdOut->_M_string_length,local_a8,
               uStack_a0);
  }
  if (bVar2) {
    pcVar1 = (captureStdErr->_M_dataplus)._M_p;
    std::__cxx11::string::
    _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)captureStdErr,pcVar1,pcVar1 + captureStdErr->_M_string_length,local_68,
               uStack_60);
  }
  iVar3 = cmsysProcess_GetState(cp);
  if (iVar3 == 4) {
    if (local_40 == (int *)0x0) {
      iVar3 = cmsysProcess_GetExitValue(cp);
      bVar8 = iVar3 == 0;
    }
    else {
      iVar3 = cmsysProcess_GetExitValue(cp);
      *local_40 = iVar3;
      bVar8 = true;
    }
  }
  else {
    iVar3 = cmsysProcess_GetState(cp);
    if (iVar3 == 2) {
      pcVar4 = cmsysProcess_GetExceptionString(cp);
      if (outputflag != OUTPUT_NONE) {
        if (pcVar4 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x5d5cd8);
        }
        else {
          sVar5 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
      }
      if (bVar2) {
        strlen(pcVar4);
        std::__cxx11::string::append((char *)captureStdErr,(ulong)pcVar4);
      }
    }
    else {
      iVar3 = cmsysProcess_GetState(cp);
      if (iVar3 == 1) {
        pcVar4 = cmsysProcess_GetErrorString(cp);
        if (outputflag != OUTPUT_NONE) {
          if (pcVar4 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x5d5cd8);
          }
          else {
            sVar5 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
          }
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
          std::ostream::put(-0x28);
          std::ostream::flush();
        }
        if (bVar2) {
          strlen(pcVar4);
          std::__cxx11::string::append((char *)captureStdErr,(ulong)pcVar4);
        }
      }
      else {
        iVar3 = cmsysProcess_GetState(cp);
        bVar8 = true;
        if (iVar3 != 5) goto LAB_00243897;
        if (outputflag != OUTPUT_NONE) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Process terminated due to timeout\n",0x22);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
          std::ostream::put(-0x28);
          std::ostream::flush();
        }
        if (bVar2) {
          std::__cxx11::string::append((char *)captureStdErr,0x4bf977);
        }
      }
    }
    bVar8 = false;
  }
LAB_00243897:
  cmsysProcess_Delete(cp);
  if (local_68 != (void *)0x0) {
    operator_delete(local_68,local_58 - (long)local_68);
  }
  if (local_a8 != (char *)0x0) {
    operator_delete(local_a8,local_98 - (long)local_a8);
  }
  if (local_88 != (char **)0x0) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  return bVar8;
}

Assistant:

bool cmSystemTools::RunSingleCommand(std::vector<std::string>const& command,
                                     std::string* captureStdOut,
                                     std::string* captureStdErr,
                                     int* retVal , const char* dir ,
                                     OutputOption outputflag ,
                                     double timeout )
{
  std::vector<const char*> argv;
  for(std::vector<std::string>::const_iterator a = command.begin();
      a != command.end(); ++a)
    {
    argv.push_back(a->c_str());
    }
  argv.push_back(0);

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, &*argv.begin());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  if(cmSystemTools::GetRunCommandHideConsole())
    {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
    }

  if (outputflag == OUTPUT_PASSTHROUGH)
    {
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDOUT, 1);
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDERR, 1);
    captureStdOut = 0;
    captureStdErr = 0;
    }
  else if (outputflag == OUTPUT_MERGE ||
           (captureStdErr && captureStdErr == captureStdOut))
    {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_MergeOutput, 1);
    captureStdErr = 0;
    }
  assert(!captureStdErr || captureStdErr != captureStdOut);

  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  std::vector<char> tempStdOut;
  std::vector<char> tempStdErr;
  char* data;
  int length;
  int pipe;
  if(outputflag != OUTPUT_PASSTHROUGH &&
     (captureStdOut || captureStdErr || outputflag != OUTPUT_NONE))
    {
    while((pipe = cmsysProcess_WaitForData(cp, &data, &length, 0)) > 0)
      {
      // Translate NULL characters in the output into valid text.
      // Visual Studio 7 puts these characters in the output of its
      // build process.
      for(int i=0; i < length; ++i)
        {
        if(data[i] == '\0')
          {
          data[i] = ' ';
          }
        }

      if (pipe == cmsysProcess_Pipe_STDOUT)
        {
        if (outputflag != OUTPUT_NONE)
          {
          cmSystemTools::Stdout(data, length);
          }
        if (captureStdOut)
          {
          tempStdOut.insert(tempStdOut.end(), data, data+length);
          }
        }
      else if (pipe == cmsysProcess_Pipe_STDERR)
        {
        if (outputflag != OUTPUT_NONE)
          {
          cmSystemTools::Stderr(data, length);
          }
        if (captureStdErr)
          {
          tempStdErr.insert(tempStdErr.end(), data, data+length);
          }
        }
      }
    }

  cmsysProcess_WaitForExit(cp, 0);
  if (captureStdOut)
    {
    captureStdOut->assign(tempStdOut.begin(), tempStdOut.end());
    }
  if (captureStdErr)
    {
    captureStdErr->assign(tempStdErr.begin(), tempStdErr.end());
    }

  bool result = true;
  if(cmsysProcess_GetState(cp) == cmsysProcess_State_Exited)
    {
    if ( retVal )
      {
      *retVal = cmsysProcess_GetExitValue(cp);
      }
    else
      {
      if ( cmsysProcess_GetExitValue(cp) !=  0 )
        {
        result = false;
        }
      }
    }
  else if(cmsysProcess_GetState(cp) == cmsysProcess_State_Exception)
    {
    const char* exception_str = cmsysProcess_GetExceptionString(cp);
    if ( outputflag != OUTPUT_NONE )
      {
      std::cerr << exception_str << std::endl;
      }
    if ( captureStdErr )
      {
      captureStdErr->append(exception_str, strlen(exception_str));
      }
    result = false;
    }
  else if(cmsysProcess_GetState(cp) == cmsysProcess_State_Error)
    {
    const char* error_str = cmsysProcess_GetErrorString(cp);
    if ( outputflag != OUTPUT_NONE )
      {
      std::cerr << error_str << std::endl;
      }
    if ( captureStdErr )
      {
      captureStdErr->append(error_str, strlen(error_str));
      }
    result = false;
    }
  else if(cmsysProcess_GetState(cp) == cmsysProcess_State_Expired)
    {
    const char* error_str = "Process terminated due to timeout\n";
    if ( outputflag != OUTPUT_NONE )
      {
      std::cerr << error_str << std::endl;
      }
    if ( captureStdErr )
      {
      captureStdErr->append(error_str, strlen(error_str));
      }
    result = false;
    }

  cmsysProcess_Delete(cp);
  return result;
}